

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execute_operator.cpp
# Opt level: O0

unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>
duckdb::ExpressionExecutor::InitializeState
          (BoundOperatorExpression *expr,ExpressionExecutorState *root)

{
  bool bVar1;
  ExpressionState *this;
  long in_RSI;
  unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_> in_RDI;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *child;
  const_iterator __end1;
  const_iterator __begin1;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *__range1;
  templated_unique_single_t *result;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  *in_stack_ffffffffffffff88;
  ExpressionState *in_stack_ffffffffffffff90;
  ExpressionExecutorState *in_stack_ffffffffffffffb0;
  BoundOperatorExpression *in_stack_ffffffffffffffb8;
  __normal_iterator<const_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
  _Stack_30;
  long lStack_28;
  undefined1 uStack_19;
  long lStack_10;
  
  uStack_19 = 0;
  lStack_10 = in_RSI;
  make_uniq<duckdb::ExpressionState,_const_duckdb::BoundOperatorExpression_&,_duckdb::ExpressionExecutorState_&>
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  lStack_28 = lStack_10 + 0x58;
  _Stack_30._M_current =
       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
       ::std::
       vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       ::begin(in_stack_ffffffffffffff88);
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::end(in_stack_ffffffffffffff88);
  while (bVar1 = __gnu_cxx::
                 operator!=<const_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
                           ((__normal_iterator<const_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
                             *)in_stack_ffffffffffffff90,
                            (__normal_iterator<const_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
                             *)in_stack_ffffffffffffff88), bVar1) {
    this = (ExpressionState *)
           __gnu_cxx::
           __normal_iterator<const_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
           ::operator*(&_Stack_30);
    unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>::
    operator->((unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>
                *)in_stack_ffffffffffffff90);
    in_stack_ffffffffffffff90 =
         (ExpressionState *)
         unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                   ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *
                    )in_stack_ffffffffffffff90);
    ExpressionState::AddChild(this,&in_stack_ffffffffffffffb8->super_Expression);
    __gnu_cxx::
    __normal_iterator<const_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
    ::operator++(&_Stack_30);
  }
  unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>::
  operator->((unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>
              *)in_stack_ffffffffffffff90);
  ExpressionState::Finalize(in_stack_ffffffffffffff90);
  return (unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>)
         (__uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>
         .super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<ExpressionState> ExpressionExecutor::InitializeState(const BoundOperatorExpression &expr,
                                                                ExpressionExecutorState &root) {
	auto result = make_uniq<ExpressionState>(expr, root);
	for (auto &child : expr.children) {
		result->AddChild(*child);
	}

	result->Finalize();
	return result;
}